

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O0

void __thiscall
icu_63::UnicodeSetStringSpan::UnicodeSetStringSpan
          (UnicodeSetStringSpan *this,UnicodeSet *set,UVector *setStrings,uint32_t which)

{
  bool bVar1;
  uint8_t uVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  int32_t iVar6;
  UnicodeString *pUVar7;
  char16_t *pcVar8;
  int32_t *piVar9;
  uint8_t *t;
  int32_t length8_2;
  uint8_t *s8_1;
  uint16_t __c2_1;
  int32_t len_1;
  uint uStack_b0;
  uint16_t __c2;
  int32_t len;
  UChar32 c;
  int32_t length8_1;
  uint8_t *s8;
  int32_t length16_1;
  UChar *s16_1;
  UnicodeString *string_1;
  int32_t utf8Count;
  int32_t allocSize;
  uint8_t *spanBackUTF8Lengths;
  uint8_t *spanUTF8Lengths;
  uint8_t *spanBackLengths;
  int32_t length8;
  UBool thisRelevant;
  int32_t length16;
  UChar *s16;
  UnicodeString *string;
  int iStack_3c;
  UBool someRelevant;
  int32_t spanLength;
  int32_t i;
  int32_t stringsLength;
  uint32_t which_local;
  UVector *setStrings_local;
  UnicodeSet *set_local;
  UnicodeSetStringSpan *this_local;
  
  UnicodeSet::UnicodeSet(&this->spanSet,0,0x10ffff);
  this->pSpanNotSet = (UnicodeSet *)0x0;
  this->strings = setStrings;
  this->utf8Lengths = (int32_t *)0x0;
  this->spanLengths = (uint8_t *)0x0;
  this->utf8 = (uint8_t *)0x0;
  this->utf8Length = 0;
  this->maxLength16 = 0;
  this->maxLength8 = 0;
  this->all = which == 0x3f;
  UnicodeSet::retainAll(&this->spanSet,set);
  if ((which & 1) != 0) {
    this->pSpanNotSet = &this->spanSet;
  }
  iVar3 = UVector::size(this->strings);
  bVar1 = false;
  for (iStack_3c = 0; iStack_3c < iVar3; iStack_3c = iStack_3c + 1) {
    pUVar7 = (UnicodeString *)UVector::elementAt(this->strings,iStack_3c);
    pcVar8 = icu_63::UnicodeString::getBuffer(pUVar7);
    iVar4 = icu_63::UnicodeString::length(pUVar7);
    iVar5 = UnicodeSet::span(&this->spanSet,pcVar8,iVar4,USET_SPAN_CONTAINED);
    if (iVar5 < iVar4) {
      bVar1 = true;
    }
    if (((which & 8) != 0) && (this->maxLength16 < iVar4)) {
      this->maxLength16 = iVar4;
    }
    if (((which & 4) != 0) && ((iVar5 < iVar4 || ((which & 2) != 0)))) {
      iVar4 = getUTF8Length(pcVar8,iVar4);
      this->utf8Length = iVar4 + this->utf8Length;
      if (this->maxLength8 < iVar4) {
        this->maxLength8 = iVar4;
      }
    }
  }
  if (bVar1) {
    if (this->all != '\0') {
      UnicodeSet::freeze(&this->spanSet);
    }
    if (this->all == '\0') {
      string_1._4_4_ = iVar3;
      if ((which & 4) != 0) {
        string_1._4_4_ = iVar3 * 5 + this->utf8Length;
      }
    }
    else {
      string_1._4_4_ = iVar3 * 8 + this->utf8Length;
    }
    if (string_1._4_4_ < 0x81) {
      this->utf8Lengths = this->staticLengths;
    }
    else {
      piVar9 = (int32_t *)uprv_malloc_63((long)string_1._4_4_);
      this->utf8Lengths = piVar9;
      if (this->utf8Lengths == (int32_t *)0x0) {
        this->maxLength8 = 0;
        this->maxLength16 = 0;
        return;
      }
    }
    if (this->all == '\0') {
      if ((which & 4) == 0) {
        this->spanLengths = (uint8_t *)this->utf8Lengths;
      }
      else {
        this->spanLengths = (uint8_t *)(this->utf8Lengths + iVar3);
        this->utf8 = this->spanLengths + iVar3;
      }
      _utf8Count = this->spanLengths;
      spanBackUTF8Lengths = _utf8Count;
      spanUTF8Lengths = _utf8Count;
    }
    else {
      this->spanLengths = (uint8_t *)(this->utf8Lengths + iVar3);
      spanUTF8Lengths = this->spanLengths + iVar3;
      spanBackUTF8Lengths = spanUTF8Lengths + iVar3;
      _utf8Count = spanBackUTF8Lengths + iVar3;
      this->utf8 = _utf8Count + iVar3;
    }
    string_1._0_4_ = 0;
    for (iStack_3c = 0; iStack_3c < iVar3; iStack_3c = iStack_3c + 1) {
      pUVar7 = (UnicodeString *)UVector::elementAt(this->strings,iStack_3c);
      pcVar8 = icu_63::UnicodeString::getBuffer(pUVar7);
      iVar4 = icu_63::UnicodeString::length(pUVar7);
      iVar5 = UnicodeSet::span(&this->spanSet,pcVar8,iVar4,USET_SPAN_CONTAINED);
      if (iVar5 < iVar4) {
        if ((which & 8) != 0) {
          if ((which & 2) == 0) {
            spanUTF8Lengths[iStack_3c] = '\0';
            this->spanLengths[iStack_3c] = '\0';
          }
          else {
            if ((which & 0x20) != 0) {
              uVar2 = makeSpanLengthByte(iVar5);
              this->spanLengths[iStack_3c] = uVar2;
            }
            if ((which & 0x10) != 0) {
              iVar5 = UnicodeSet::spanBack(&this->spanSet,pcVar8,iVar4,USET_SPAN_CONTAINED);
              uVar2 = makeSpanLengthByte(iVar4 - iVar5);
              spanUTF8Lengths[iStack_3c] = uVar2;
            }
          }
        }
        if ((which & 4) != 0) {
          t = this->utf8 + (int)string_1;
          iVar5 = appendUTF8(pcVar8,iVar4,t,this->utf8Length - (int)string_1);
          this->utf8Lengths[iStack_3c] = iVar5;
          string_1._0_4_ = iVar5 + (int)string_1;
          if (iVar5 == 0) {
            _utf8Count[iStack_3c] = 0xff;
            spanBackUTF8Lengths[iStack_3c] = 0xff;
          }
          else if ((which & 2) == 0) {
            _utf8Count[iStack_3c] = '\0';
            spanBackUTF8Lengths[iStack_3c] = '\0';
          }
          else {
            if ((which & 0x20) != 0) {
              iVar6 = UnicodeSet::spanUTF8(&this->spanSet,(char *)t,iVar5,USET_SPAN_CONTAINED);
              uVar2 = makeSpanLengthByte(iVar6);
              spanBackUTF8Lengths[iStack_3c] = uVar2;
            }
            if ((which & 0x10) != 0) {
              iVar6 = UnicodeSet::spanBackUTF8(&this->spanSet,(char *)t,iVar5,USET_SPAN_CONTAINED);
              uVar2 = makeSpanLengthByte(iVar5 - iVar6);
              _utf8Count[iStack_3c] = uVar2;
            }
          }
        }
        if ((which & 1) != 0) {
          if ((which & 0x20) != 0) {
            uStack_b0 = (uint)(ushort)*pcVar8;
            if ((((uStack_b0 & 0xfffffc00) == 0xd800) && (iVar4 != 1)) &&
               ((pcVar8[1] & 0xfc00U) == 0xdc00)) {
              uStack_b0 = uStack_b0 * 0x400 + (uint)(ushort)pcVar8[1] + 0xfca02400;
            }
            addToSpanNotSet(this,uStack_b0);
          }
          if ((which & 0x10) != 0) {
            uStack_b0 = (uint)(ushort)pcVar8[iVar4 + -1];
            if ((((uStack_b0 & 0xfffffc00) == 0xdc00) && (0 < iVar4 + -1)) &&
               ((pcVar8[iVar4 + -2] & 0xfc00U) == 0xd800)) {
              uStack_b0 = (uint)(ushort)pcVar8[iVar4 + -2] * 0x400 + uStack_b0 + 0xfca02400;
            }
            addToSpanNotSet(this,uStack_b0);
          }
        }
      }
      else {
        if ((which & 4) != 0) {
          if ((which & 2) == 0) {
            this->utf8Lengths[iStack_3c] = 0;
          }
          else {
            iVar4 = appendUTF8(pcVar8,iVar4,this->utf8 + (int)string_1,
                               this->utf8Length - (int)string_1);
            this->utf8Lengths[iStack_3c] = iVar4;
            string_1._0_4_ = iVar4 + (int)string_1;
          }
        }
        if (this->all == '\0') {
          this->spanLengths[iStack_3c] = 0xff;
        }
        else {
          _utf8Count[iStack_3c] = 0xff;
          spanBackUTF8Lengths[iStack_3c] = 0xff;
          spanUTF8Lengths[iStack_3c] = 0xff;
          this->spanLengths[iStack_3c] = 0xff;
        }
      }
    }
    if (this->all != '\0') {
      UnicodeSet::freeze(this->pSpanNotSet);
    }
  }
  else {
    this->maxLength8 = 0;
    this->maxLength16 = 0;
  }
  return;
}

Assistant:

UnicodeSetStringSpan::UnicodeSetStringSpan(const UnicodeSet &set,
                                           const UVector &setStrings,
                                           uint32_t which)
        : spanSet(0, 0x10ffff), pSpanNotSet(NULL), strings(setStrings),
          utf8Lengths(NULL), spanLengths(NULL), utf8(NULL),
          utf8Length(0),
          maxLength16(0), maxLength8(0),
          all((UBool)(which==ALL)) {
    spanSet.retainAll(set);
    if(which&NOT_CONTAINED) {
        // Default to the same sets.
        // addToSpanNotSet() will create a separate set if necessary.
        pSpanNotSet=&spanSet;
    }

    // Determine if the strings even need to be taken into account at all for span() etc.
    // If any string is relevant, then all strings need to be used for
    // span(longest match) but only the relevant ones for span(while contained).
    // TODO: Possible optimization: Distinguish CONTAINED vs. LONGEST_MATCH
    //   and do not store UTF-8 strings if !thisRelevant and CONTAINED.
    //   (Only store irrelevant UTF-8 strings for LONGEST_MATCH where they are relevant after all.)
    // Also count the lengths of the UTF-8 versions of the strings for memory allocation.
    int32_t stringsLength=strings.size();

    int32_t i, spanLength;
    UBool someRelevant=FALSE;
    for(i=0; i<stringsLength; ++i) {
        const UnicodeString &string=*(const UnicodeString *)strings.elementAt(i);
        const UChar *s16=string.getBuffer();
        int32_t length16=string.length();
        UBool thisRelevant;
        spanLength=spanSet.span(s16, length16, USET_SPAN_CONTAINED);
        if(spanLength<length16) {  // Relevant string.
            someRelevant=thisRelevant=TRUE;
        } else {
            thisRelevant=FALSE;
        }
        if((which&UTF16) && length16>maxLength16) {
            maxLength16=length16;
        }
        if((which&UTF8) && (thisRelevant || (which&CONTAINED))) {
            int32_t length8=getUTF8Length(s16, length16);
            utf8Length+=length8;
            if(length8>maxLength8) {
                maxLength8=length8;
            }
        }
    }
    if(!someRelevant) {
        maxLength16=maxLength8=0;
        return;
    }

    // Freeze after checking for the need to use strings at all because freezing
    // a set takes some time and memory which are wasted if there are no relevant strings.
    if(all) {
        spanSet.freeze();
    }

    uint8_t *spanBackLengths;
    uint8_t *spanUTF8Lengths;
    uint8_t *spanBackUTF8Lengths;

    // Allocate a block of meta data.
    int32_t allocSize;
    if(all) {
        // UTF-8 lengths, 4 sets of span lengths, UTF-8 strings.
        allocSize=stringsLength*(4+1+1+1+1)+utf8Length;
    } else {
        allocSize=stringsLength;  // One set of span lengths.
        if(which&UTF8) {
            // UTF-8 lengths and UTF-8 strings.
            allocSize+=stringsLength*4+utf8Length;
        }
    }
    if(allocSize<=(int32_t)sizeof(staticLengths)) {
        utf8Lengths=staticLengths;
    } else {
        utf8Lengths=(int32_t *)uprv_malloc(allocSize);
        if(utf8Lengths==NULL) {
            maxLength16=maxLength8=0;  // Prevent usage by making needsStringSpanUTF16/8() return FALSE.
            return;  // Out of memory.
        }
    }

    if(all) {
        // Store span lengths for all span() variants.
        spanLengths=(uint8_t *)(utf8Lengths+stringsLength);
        spanBackLengths=spanLengths+stringsLength;
        spanUTF8Lengths=spanBackLengths+stringsLength;
        spanBackUTF8Lengths=spanUTF8Lengths+stringsLength;
        utf8=spanBackUTF8Lengths+stringsLength;
    } else {
        // Store span lengths for only one span() variant.
        if(which&UTF8) {
            spanLengths=(uint8_t *)(utf8Lengths+stringsLength);
            utf8=spanLengths+stringsLength;
        } else {
            spanLengths=(uint8_t *)utf8Lengths;
        }
        spanBackLengths=spanUTF8Lengths=spanBackUTF8Lengths=spanLengths;
    }

    // Set the meta data and pSpanNotSet and write the UTF-8 strings.
    int32_t utf8Count=0;  // Count UTF-8 bytes written so far.

    for(i=0; i<stringsLength; ++i) {
        const UnicodeString &string=*(const UnicodeString *)strings.elementAt(i);
        const UChar *s16=string.getBuffer();
        int32_t length16=string.length();
        spanLength=spanSet.span(s16, length16, USET_SPAN_CONTAINED);
        if(spanLength<length16) {  // Relevant string.
            if(which&UTF16) {
                if(which&CONTAINED) {
                    if(which&FWD) {
                        spanLengths[i]=makeSpanLengthByte(spanLength);
                    }
                    if(which&BACK) {
                        spanLength=length16-spanSet.spanBack(s16, length16, USET_SPAN_CONTAINED);
                        spanBackLengths[i]=makeSpanLengthByte(spanLength);
                    }
                } else /* not CONTAINED, not all, but NOT_CONTAINED */ {
                    spanLengths[i]=spanBackLengths[i]=0;  // Only store a relevant/irrelevant flag.
                }
            }
            if(which&UTF8) {
                uint8_t *s8=utf8+utf8Count;
                int32_t length8=appendUTF8(s16, length16, s8, utf8Length-utf8Count);
                utf8Count+=utf8Lengths[i]=length8;
                if(length8==0) {  // Irrelevant for UTF-8 because not representable in UTF-8.
                    spanUTF8Lengths[i]=spanBackUTF8Lengths[i]=(uint8_t)ALL_CP_CONTAINED;
                } else {  // Relevant for UTF-8.
                    if(which&CONTAINED) {
                        if(which&FWD) {
                            spanLength=spanSet.spanUTF8((const char *)s8, length8, USET_SPAN_CONTAINED);
                            spanUTF8Lengths[i]=makeSpanLengthByte(spanLength);
                        }
                        if(which&BACK) {
                            spanLength=length8-spanSet.spanBackUTF8((const char *)s8, length8, USET_SPAN_CONTAINED);
                            spanBackUTF8Lengths[i]=makeSpanLengthByte(spanLength);
                        }
                    } else /* not CONTAINED, not all, but NOT_CONTAINED */ {
                        spanUTF8Lengths[i]=spanBackUTF8Lengths[i]=0;  // Only store a relevant/irrelevant flag.
                    }
                }
            }
            if(which&NOT_CONTAINED) {
                // Add string start and end code points to the spanNotSet so that
                // a span(while not contained) stops before any string.
                UChar32 c;
                if(which&FWD) {
                    int32_t len=0;
                    U16_NEXT(s16, len, length16, c);
                    addToSpanNotSet(c);
                }
                if(which&BACK) {
                    int32_t len=length16;
                    U16_PREV(s16, 0, len, c);
                    addToSpanNotSet(c);
                }
            }
        } else {  // Irrelevant string.
            if(which&UTF8) {
                if(which&CONTAINED) {  // Only necessary for LONGEST_MATCH.
                    uint8_t *s8=utf8+utf8Count;
                    int32_t length8=appendUTF8(s16, length16, s8, utf8Length-utf8Count);
                    utf8Count+=utf8Lengths[i]=length8;
                } else {
                    utf8Lengths[i]=0;
                }
            }
            if(all) {
                spanLengths[i]=spanBackLengths[i]=
                    spanUTF8Lengths[i]=spanBackUTF8Lengths[i]=
                        (uint8_t)ALL_CP_CONTAINED;
            } else {
                // All spanXYZLengths pointers contain the same address.
                spanLengths[i]=(uint8_t)ALL_CP_CONTAINED;
            }
        }
    }

    // Finish.
    if(all) {
        pSpanNotSet->freeze();
    }
}